

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cc
# Opt level: O0

void test(void)

{
  unsigned_long_long uVar1;
  void *pvVar2;
  longlong lVar3;
  Pl_Buffer *this;
  undefined1 local_88 [8];
  BitWriter bw;
  Pl_Buffer *bp;
  undefined1 local_60 [7];
  uchar ch;
  BitStream b;
  exception *e;
  size_t local_20;
  size_t bits_available;
  size_t bit_offset;
  uchar *p;
  
  bit_offset = (size_t)test::buf;
  bits_available = 7;
  local_20 = 0x40;
  print_values(0,7,0x40);
  test_read_bits(test::buf,(uchar **)&bit_offset,&bits_available,&local_20,5);
  test_read_bits(test::buf,(uchar **)&bit_offset,&bits_available,&local_20,4);
  test_read_bits(test::buf,(uchar **)&bit_offset,&bits_available,&local_20,6);
  test_read_bits(test::buf,(uchar **)&bit_offset,&bits_available,&local_20,9);
  test_read_bits(test::buf,(uchar **)&bit_offset,&bits_available,&local_20,9);
  test_read_bits(test::buf,(uchar **)&bit_offset,&bits_available,&local_20,2);
  test_read_bits(test::buf,(uchar **)&bit_offset,&bits_available,&local_20,1);
  test_read_bits(test::buf,(uchar **)&bit_offset,&bits_available,&local_20,0);
  test_read_bits(test::buf,(uchar **)&bit_offset,&bits_available,&local_20,0x19);
  test_read_bits(test::buf,(uchar **)&bit_offset,&bits_available,&local_20,4);
  test_read_bits(test::buf,(uchar **)&bit_offset,&bits_available,&local_20,3);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  bit_offset = (size_t)test::buf;
  bits_available = 7;
  local_20 = 0x40;
  print_values(0,7,0x40);
  test_read_bits(test::buf,(uchar **)&bit_offset,&bits_available,&local_20,0x20);
  test_read_bits(test::buf,(uchar **)&bit_offset,&bits_available,&local_20,0x20);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  BitStream::BitStream((BitStream *)local_60,test::buf,8);
  uVar1 = BitStream::getBits((BitStream *)local_60,0x20);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,uVar1);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  BitStream::reset((BitStream *)local_60);
  uVar1 = BitStream::getBits((BitStream *)local_60,0x20);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,uVar1);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  uVar1 = BitStream::getBits((BitStream *)local_60,0x20);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,uVar1);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  BitStream::reset((BitStream *)local_60);
  uVar1 = BitStream::getBits((BitStream *)local_60,6);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,uVar1);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  BitStream::skipToNextByte((BitStream *)local_60);
  uVar1 = BitStream::getBits((BitStream *)local_60,8);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,uVar1);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  BitStream::skipToNextByte((BitStream *)local_60);
  uVar1 = BitStream::getBits((BitStream *)local_60,8);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,uVar1);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  BitStream::reset((BitStream *)local_60);
  lVar3 = BitStream::getBitsSigned((BitStream *)local_60,3);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,lVar3);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  lVar3 = BitStream::getBitsSigned((BitStream *)local_60,6);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,lVar3);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  lVar3 = BitStream::getBitsSigned((BitStream *)local_60,5);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,lVar3);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  lVar3 = BitStream::getBitsSigned((BitStream *)local_60,1);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,lVar3);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  lVar3 = BitStream::getBitsSigned((BitStream *)local_60,0x11);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,lVar3);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  bp._7_1_ = 0;
  bits_available = 7;
  this = (Pl_Buffer *)operator_new(0x38);
  Pl_Buffer::Pl_Buffer(this,"buffer",(Pipeline *)0x0);
  bw.bit_offset = (size_t)this;
  test_write_bits((uchar *)((long)&bp + 7),&bits_available,0x1e,5,this);
  test_write_bits((uchar *)((long)&bp + 7),&bits_available,10,4,(Pl_Buffer *)bw.bit_offset);
  test_write_bits((uchar *)((long)&bp + 7),&bits_available,10,6,(Pl_Buffer *)bw.bit_offset);
  test_write_bits((uchar *)((long)&bp + 7),&bits_available,0x3ebb,0,(Pl_Buffer *)bw.bit_offset);
  test_write_bits((uchar *)((long)&bp + 7),&bits_available,0x165,9,(Pl_Buffer *)bw.bit_offset);
  print_buffer((Pl_Buffer *)bw.bit_offset);
  test_write_bits((uchar *)((long)&bp + 7),&bits_available,0xf2,9,(Pl_Buffer *)bw.bit_offset);
  test_write_bits((uchar *)((long)&bp + 7),&bits_available,0,2,(Pl_Buffer *)bw.bit_offset);
  test_write_bits((uchar *)((long)&bp + 7),&bits_available,1,1,(Pl_Buffer *)bw.bit_offset);
  test_write_bits((uchar *)((long)&bp + 7),&bits_available,0x512ea9,0x19,(Pl_Buffer *)bw.bit_offset)
  ;
  test_write_bits((uchar *)((long)&bp + 7),&bits_available,3,3,(Pl_Buffer *)bw.bit_offset);
  print_buffer((Pl_Buffer *)bw.bit_offset);
  test_write_bits((uchar *)((long)&bp + 7),&bits_available,0xf5156579,0x20,
                  (Pl_Buffer *)bw.bit_offset);
  test_write_bits((uchar *)((long)&bp + 7),&bits_available,0x1289754b,0x20,
                  (Pl_Buffer *)bw.bit_offset);
  print_buffer((Pl_Buffer *)bw.bit_offset);
  BitWriter::BitWriter((BitWriter *)local_88,(Pipeline *)bw.bit_offset);
  BitWriter::writeBits((BitWriter *)local_88,0x1e,5);
  BitWriter::flush((BitWriter *)local_88);
  BitWriter::flush((BitWriter *)local_88);
  BitWriter::writeBitsInt((BitWriter *)local_88,0xab,8);
  BitWriter::flush((BitWriter *)local_88);
  print_buffer((Pl_Buffer *)bw.bit_offset);
  BitWriter::writeBitsSigned((BitWriter *)local_88,-1,3);
  BitWriter::writeBitsSigned((BitWriter *)local_88,-0xc,6);
  BitWriter::writeBitsSigned((BitWriter *)local_88,4,3);
  BitWriter::writeBitsSigned((BitWriter *)local_88,-4,3);
  BitWriter::writeBitsSigned((BitWriter *)local_88,-1,1);
  BitWriter::flush((BitWriter *)local_88);
  print_buffer((Pl_Buffer *)bw.bit_offset);
  if (bw.bit_offset != 0) {
    (**(code **)(*(long *)bw.bit_offset + 8))();
  }
  return;
}

Assistant:

static void
test()
{
    // 11110101 00010101 01100101 01111001 00010010 10001001 01110101 01001011
    // F5 15 65 79 12 89 75 4B

    // Read tests

    static unsigned char const buf[] = {0xF5, 0x15, 0x65, 0x79, 0x12, 0x89, 0x75, 0x4B};

    unsigned char const* p = buf;
    size_t bit_offset = 7;
    size_t bits_available = 64;

    // 11110:101 0:001010:1 01100101: 01111001
    // 0:00:1:0010 10001001 01110101 01001:011
    print_values(p - buf, bit_offset, bits_available);
    test_read_bits(buf, p, bit_offset, bits_available, 5);
    test_read_bits(buf, p, bit_offset, bits_available, 4);
    test_read_bits(buf, p, bit_offset, bits_available, 6);
    test_read_bits(buf, p, bit_offset, bits_available, 9);
    test_read_bits(buf, p, bit_offset, bits_available, 9);
    test_read_bits(buf, p, bit_offset, bits_available, 2);
    test_read_bits(buf, p, bit_offset, bits_available, 1);
    test_read_bits(buf, p, bit_offset, bits_available, 0);
    test_read_bits(buf, p, bit_offset, bits_available, 25);

    try {
        test_read_bits(buf, p, bit_offset, bits_available, 4);
    } catch (std::exception& e) {
        std::cout << "exception: " << e.what() << std::endl;
        print_values(p - buf, bit_offset, bits_available);
    }

    test_read_bits(buf, p, bit_offset, bits_available, 3);
    std::cout << std::endl;

    // 11110101 00010101 01100101 01111001: 00010010 10001001 01110101 01001011

    p = buf;
    bit_offset = 7;
    bits_available = 64;
    print_values(p - buf, bit_offset, bits_available);
    test_read_bits(buf, p, bit_offset, bits_available, 32);
    test_read_bits(buf, p, bit_offset, bits_available, 32);
    std::cout << std::endl;

    BitStream b(buf, 8);
    std::cout << b.getBits(32) << std::endl;
    b.reset();
    std::cout << b.getBits(32) << std::endl;
    std::cout << b.getBits(32) << std::endl;
    std::cout << std::endl;

    b.reset();
    std::cout << b.getBits(6) << std::endl;
    b.skipToNextByte();
    std::cout << b.getBits(8) << std::endl;
    b.skipToNextByte();
    std::cout << b.getBits(8) << std::endl;
    std::cout << std::endl;
    b.reset();
    std::cout << b.getBitsSigned(3) << std::endl;
    std::cout << b.getBitsSigned(6) << std::endl;
    std::cout << b.getBitsSigned(5) << std::endl;
    std::cout << b.getBitsSigned(1) << std::endl;
    std::cout << b.getBitsSigned(17) << std::endl;
    std::cout << std::endl;

    // Write tests

    // 11110:101 0:001010:1 01100101: 01111001
    // 0:00:1:0010 10001001 01110101 01001:011

    unsigned char ch = 0;
    bit_offset = 7;
    auto* bp = new Pl_Buffer("buffer");

    test_write_bits(ch, bit_offset, 30UL, 5, bp);
    test_write_bits(ch, bit_offset, 10UL, 4, bp);
    test_write_bits(ch, bit_offset, 10UL, 6, bp);
    test_write_bits(ch, bit_offset, 16059UL, 0, bp);
    test_write_bits(ch, bit_offset, 357UL, 9, bp);
    print_buffer(bp);

    test_write_bits(ch, bit_offset, 242UL, 9, bp);
    test_write_bits(ch, bit_offset, 0UL, 2, bp);
    test_write_bits(ch, bit_offset, 1UL, 1, bp);
    test_write_bits(ch, bit_offset, 5320361UL, 25, bp);
    test_write_bits(ch, bit_offset, 3UL, 3, bp);

    print_buffer(bp);
    test_write_bits(ch, bit_offset, 4111820153UL, 32, bp);
    test_write_bits(ch, bit_offset, 310998347UL, 32, bp);
    print_buffer(bp);

    BitWriter bw(bp);
    bw.writeBits(30UL, 5);
    bw.flush();
    bw.flush();
    bw.writeBitsInt(0xAB, 8);
    bw.flush();
    print_buffer(bp);
    bw.writeBitsSigned(-1, 3);  // 111
    bw.writeBitsSigned(-12, 6); // 110100
    bw.writeBitsSigned(4, 3);   // 100
    bw.writeBitsSigned(-4, 3);  // 100
    bw.writeBitsSigned(-1, 1);  // 1
    bw.flush();
    print_buffer(bp);

    delete bp;
}